

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void createPlayerMapping(void)

{
  __enable_if_t<is_constructible<value_type,_pair<const_char_*,_Player_*(*)(basic_string<char>)>_>::value,_pair<iterator,_bool>_>
  _Var1;
  _func_Player_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  pair<const_char_*,_Player_*(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_b8;
  _Base_ptr local_a8;
  undefined1 local_a0;
  _func_Player_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  pair<const_char_*,_Player_*(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_90;
  _Base_ptr local_80;
  undefined1 local_78;
  _func_Player_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  pair<const_char_*,_Player_*(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_68;
  _Base_ptr local_58;
  undefined1 local_50;
  _func_Player_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  pair<const_char_*,_Player_*(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_40;
  _Base_ptr local_30;
  undefined1 local_28;
  _func_Player_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  pair<const_char_*,_Player_*(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_18;
  
  local_20 = createInstance<ExampleBot>;
  local_18 = std::make_pair<char_const(&)[8],Player*(*)(std::__cxx11::string)>
                       ((char (*) [8])"Patrick",&local_20);
  _Var1 = std::
          map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
          ::insert<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
                    ((map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
                      *)&map_abi_cxx11_,&local_18);
  local_30 = (_Base_ptr)_Var1.first._M_node;
  local_28 = _Var1.second;
  local_48 = createInstance<ExampleBot>;
  local_40 = std::make_pair<char_const(&)[6],Player*(*)(std::__cxx11::string)>
                       ((char (*) [6])"Felix",&local_48);
  _Var1 = std::
          map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
          ::insert<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
                    ((map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
                      *)&map_abi_cxx11_,&local_40);
  local_58 = (_Base_ptr)_Var1.first._M_node;
  local_50 = _Var1.second;
  local_70 = createInstance<ExampleBot>;
  local_68 = std::make_pair<char_const(&)[10],Player*(*)(std::__cxx11::string)>
                       ((char (*) [10])"Christoph",&local_70);
  _Var1 = std::
          map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
          ::insert<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
                    ((map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
                      *)&map_abi_cxx11_,&local_68);
  local_80 = (_Base_ptr)_Var1.first._M_node;
  local_78 = _Var1.second;
  local_98 = createInstance<ExampleBot>;
  local_90 = std::make_pair<char_const(&)[8],Player*(*)(std::__cxx11::string)>
                       ((char (*) [8])"Juergen",&local_98);
  _Var1 = std::
          map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
          ::insert<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
                    ((map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
                      *)&map_abi_cxx11_,&local_90);
  local_a8 = (_Base_ptr)_Var1.first._M_node;
  local_a0 = _Var1.second;
  local_c0 = createInstance<ExampleBot>;
  local_b8 = std::make_pair<char_const(&)[8],Player*(*)(std::__cxx11::string)>
                       ((char (*) [8])"Mathias",&local_c0);
  std::
  map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
  ::insert<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
            ((map<std::__cxx11::string,Player*(*)(std::__cxx11::string),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
              *)&map_abi_cxx11_,&local_b8);
  return;
}

Assistant:

void createPlayerMapping() {
    map.insert(std::make_pair("Patrick", &createInstance<ExampleBot>));
    map.insert(std::make_pair("Felix", &createInstance<ExampleBot>));
    map.insert(std::make_pair("Christoph", &createInstance<ExampleBot>));
    map.insert(std::make_pair("Juergen", &createInstance<ExampleBot>));
    map.insert(std::make_pair("Mathias", &createInstance<ExampleBot>));
}